

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Printer::CopyToBuffer(Printer *this,char *data,int size)

{
  uint uVar1;
  int iVar2;
  char *in_RAX;
  size_t __n;
  char *local_38;
  void *void_buffer;
  
  if ((size != 0) && (this->failed_ == false)) {
    local_38 = in_RAX;
    while( true ) {
      uVar1 = this->buffer_size_;
      if (size <= (int)uVar1) break;
      if (0 < (int)uVar1) {
        memcpy(this->buffer_,data,(ulong)uVar1);
        iVar2 = this->buffer_size_;
        this->offset_ = this->offset_ + (long)iVar2;
        data = data + iVar2;
        size = size - iVar2;
      }
      iVar2 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&local_38,&this->buffer_size_);
      this->failed_ = (bool)((byte)iVar2 ^ 1);
      if ((byte)iVar2 == 0) {
        return;
      }
      this->buffer_ = local_38;
    }
    __n = (size_t)size;
    memcpy(this->buffer_,data,__n);
    this->buffer_ = this->buffer_ + __n;
    this->buffer_size_ = this->buffer_size_ - size;
    this->offset_ = this->offset_ + __n;
  }
  return;
}

Assistant:

void Printer::CopyToBuffer(const char* data, int size) {
  if (failed_) return;
  if (size == 0) return;

  while (size > buffer_size_) {
    // Data exceeds space in the buffer.  Copy what we can and request a
    // new buffer.
    if (buffer_size_ > 0) {
      memcpy(buffer_, data, buffer_size_);
      offset_ += buffer_size_;
      data += buffer_size_;
      size -= buffer_size_;
    }
    void* void_buffer;
    failed_ = !output_->Next(&void_buffer, &buffer_size_);
    if (failed_) return;
    buffer_ = reinterpret_cast<char*>(void_buffer);
  }

  // Buffer is big enough to receive the data; copy it.
  memcpy(buffer_, data, size);
  buffer_ += size;
  buffer_size_ -= size;
  offset_ += size;
}